

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  orientation_flags_t *poVar1;
  bool bVar2;
  ulong uVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  uint uVar5;
  ulong uVar6;
  mipmapped_texture temp_tex;
  mipmapped_texture mStack_68;
  
  mipmapped_texture(&mStack_68,this);
  bVar2 = flip_y_helper(&mStack_68);
  if (!bVar2) {
    operator=(&mStack_68,this);
    unpack_from_dxt(&mStack_68,false);
    bVar2 = flip_y_helper(&mStack_68);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_001404c6;
    }
  }
  swap(this,&mStack_68);
  bVar2 = true;
  if ((update_orientation_flags) && (uVar5 = (this->m_faces).m_size, uVar5 != 0)) {
    pvVar4 = (this->m_faces).m_p;
    uVar3 = 0;
    do {
      if (pvVar4[uVar3].m_size != 0) {
        uVar6 = 0;
        do {
          poVar1 = &pvVar4[uVar3].m_p[uVar6]->m_orient_flags;
          *poVar1 = *poVar1 ^ cOrientationFlagYFlipped;
          uVar6 = uVar6 + 1;
          pvVar4 = (this->m_faces).m_p;
        } while (uVar6 < pvVar4[uVar3].m_size);
        uVar5 = (this->m_faces).m_size;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar5);
  }
LAB_001404c6:
  ~mipmapped_texture(&mStack_68);
  return bVar2;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}